

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O0

bool __thiscall
dlib::mfp_kernel_1_base_class<1UL>::
mp_impl_T<dlib::member_function_pointer<unsigned_long,_void,_void,_void>::mp_impl<dlib::open_file_box_helper::box_win>_>
::is_same(mp_impl_T<dlib::member_function_pointer<unsigned_long,_void,_void,_void>::mp_impl<dlib::open_file_box_helper::box_win>_>
          *this,mp_base_base *item)

{
  mp_impl<dlib::open_file_box_helper::box_win> *i;
  mp_base_base *item_local;
  mp_impl_T<dlib::member_function_pointer<unsigned_long,_void,_void,_void>::mp_impl<dlib::open_file_box_helper::box_win>_>
  *this_local;
  bool local_1;
  
  if ((item->o == (void *)0x0) &&
     ((this->super_mp_impl<dlib::open_file_box_helper::box_win>).super_mp_base.super_mp_base_base.o
      == (void *)0x0)) {
    local_1 = true;
  }
  else if ((item->o ==
            (this->super_mp_impl<dlib::open_file_box_helper::box_win>).super_mp_base.
            super_mp_base_base.o) &&
          ((this->super_mp_impl<dlib::open_file_box_helper::box_win>).super_mp_base.
           super_mp_base_base.type == item->type)) {
    local_1 = item[1]._vptr_mp_base_base ==
              (_func_int **)(this->super_mp_impl<dlib::open_file_box_helper::box_win>).callback &&
              (item[1]._vptr_mp_base_base == (_func_int **)0x0 ||
              item[1].o ==
              *(void **)&(this->super_mp_impl<dlib::open_file_box_helper::box_win>).field_0x20);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_same (const mp_base_base* item) const 
            {
                if (item->o == 0 && this->o == 0)
                {
                    return true;
                }
                else if (item->o == this->o && this->type == item->type)
                {
                    const mp_impl* i = reinterpret_cast<const mp_impl*>(item);
                    return (i->callback == this->callback);
                }
                return false;
            }